

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OPC_TreeBuilders.cpp
# Opt level: O1

bool __thiscall
Opcode::AABBTreeOfTrianglesBuilder::ComputeGlobalBox
          (AABBTreeOfTrianglesBuilder *this,udword *primitives,udword nb_prims,AABB *global_box)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  udword uVar10;
  MeshInterface *pMVar11;
  IndexedTriangle *pIVar12;
  Point *pPVar13;
  ulong uVar14;
  long lVar15;
  ulong uVar16;
  ulong uVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  
  if (nb_prims != 0 && primitives != (udword *)0x0) {
    pMVar11 = this->mIMesh;
    pIVar12 = pMVar11->mTris;
    pPVar13 = pMVar11->mVerts;
    uVar10 = pMVar11->mVertexStride;
    fVar18 = -3.4028235e+38;
    fVar19 = 3.4028235e+38;
    lVar15 = 0;
    fVar22 = 3.4028235e+38;
    fVar23 = 3.4028235e+38;
    fVar20 = -3.4028235e+38;
    fVar21 = -3.4028235e+38;
    do {
      uVar14 = (ulong)(primitives[lVar15] * pMVar11->mTriStride);
      uVar16 = (ulong)(*(int *)((long)pIVar12->mVRef + uVar14) * uVar10);
      uVar17 = (ulong)(*(int *)((long)pIVar12->mVRef + uVar14 + 4) * uVar10);
      uVar14 = (ulong)(*(int *)((long)pIVar12->mVRef + uVar14 + 8) * uVar10);
      fVar1 = *(float *)((long)&pPVar13->x + uVar16);
      fVar2 = *(float *)((long)&pPVar13->y + uVar16);
      if (fVar1 <= fVar23) {
        fVar23 = fVar1;
      }
      if (fVar2 <= fVar22) {
        fVar22 = fVar2;
      }
      fVar3 = *(float *)((long)&pPVar13->z + uVar16);
      if (fVar3 <= fVar19) {
        fVar19 = fVar3;
      }
      fVar4 = *(float *)((long)&pPVar13->x + uVar17);
      fVar5 = *(float *)((long)&pPVar13->y + uVar17);
      if (fVar4 <= fVar23) {
        fVar23 = fVar4;
      }
      if (fVar5 <= fVar22) {
        fVar22 = fVar5;
      }
      fVar6 = *(float *)((long)&pPVar13->z + uVar17);
      if (fVar6 <= fVar19) {
        fVar19 = fVar6;
      }
      fVar7 = *(float *)((long)&pPVar13->x + uVar14);
      fVar8 = *(float *)((long)&pPVar13->y + uVar14);
      if (fVar7 <= fVar23) {
        fVar23 = fVar7;
      }
      if (fVar8 <= fVar22) {
        fVar22 = fVar8;
      }
      fVar9 = *(float *)((long)&pPVar13->z + uVar14);
      if (fVar9 <= fVar19) {
        fVar19 = fVar9;
      }
      if (fVar18 <= fVar1) {
        fVar18 = fVar1;
      }
      if (fVar20 <= fVar2) {
        fVar20 = fVar2;
      }
      if (fVar21 <= fVar3) {
        fVar21 = fVar3;
      }
      if (fVar18 <= fVar4) {
        fVar18 = fVar4;
      }
      if (fVar20 <= fVar5) {
        fVar20 = fVar5;
      }
      if (fVar21 <= fVar6) {
        fVar21 = fVar6;
      }
      if (fVar18 <= fVar7) {
        fVar18 = fVar7;
      }
      if (fVar20 <= fVar8) {
        fVar20 = fVar8;
      }
      if (fVar21 <= fVar9) {
        fVar21 = fVar9;
      }
      lVar15 = lVar15 + 1;
    } while (nb_prims != (udword)lVar15);
    (global_box->mCenter).x = (fVar18 + fVar23) * 0.5;
    (global_box->mCenter).y = (fVar20 + fVar22) * 0.5;
    (global_box->mCenter).z = (fVar21 + fVar19) * 0.5;
    (global_box->mExtents).x = (fVar18 - fVar23) * 0.5;
    (global_box->mExtents).y = (fVar20 - fVar22) * 0.5;
    (global_box->mExtents).z = (fVar21 - fVar19) * 0.5;
  }
  return nb_prims != 0 && primitives != (udword *)0x0;
}

Assistant:

bool AABBTreeOfTrianglesBuilder::ComputeGlobalBox(const udword* primitives, udword nb_prims, AABB& global_box) const
{
	// Checkings
	if(!primitives || !nb_prims)	return false;

	// Initialize global box
	Point Min(MAX_FLOAT, MAX_FLOAT, MAX_FLOAT);
	Point Max(MIN_FLOAT, MIN_FLOAT, MIN_FLOAT);

	// Loop through triangles
	VertexPointers VP;
	while(nb_prims--)
	{
		// Get current triangle-vertices
		mIMesh->GetTriangle(VP, *primitives++);
		// Update global box
		Min.Min(*VP.Vertex[0]).Min(*VP.Vertex[1]).Min(*VP.Vertex[2]);
		Max.Max(*VP.Vertex[0]).Max(*VP.Vertex[1]).Max(*VP.Vertex[2]);
	}
	global_box.SetMinMax(Min, Max);
	return true;
}